

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void EV_LightTurnOnPartway(int tag,double frac)

{
  sector_t_conflict *sec;
  sector_t_conflict *psVar1;
  int local_44;
  int local_40;
  int min;
  int bright;
  int j;
  sector_t *sector;
  sector_t *temp;
  FSectorTagIterator it;
  int secnum;
  double frac_local;
  int tag_local;
  
  unique0x10000106 = frac;
  register0x00001200 = clamp<double>(frac,0.0,1.0);
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)((long)&temp + 4),tag);
  while (it.searchtag = FSectorTagIterator::Next((FSectorTagIterator *)((long)&temp + 4)),
        -1 < it.searchtag) {
    sec = sectors + it.searchtag;
    local_40 = 0;
    local_44 = (int)sec->lightlevel;
    for (min = 0; min < sec->linecount; min = min + 1) {
      psVar1 = getNextSector(sec->lines[min],sec);
      if (psVar1 != (sector_t_conflict *)0x0) {
        if (local_40 < psVar1->lightlevel) {
          local_40 = (int)psVar1->lightlevel;
        }
        if (psVar1->lightlevel < local_44) {
          local_44 = (int)psVar1->lightlevel;
        }
      }
    }
    sector_t::SetLightLevel
              ((sector_t *)sec,
               (int)(stack0xffffffffffffffe8 * (double)local_40 +
                    (1.0 - stack0xffffffffffffffe8) * (double)local_44));
  }
  return;
}

Assistant:

void EV_LightTurnOnPartway (int tag, double frac)
{
	frac = clamp(frac, 0., 1.);

	// Search all sectors for ones with same tag as activating line
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *temp, *sector = &sectors[secnum];
		int j, bright = 0, min = sector->lightlevel;

		for (j = 0; j < sector->linecount; ++j)
		{
			if ((temp = getNextSector (sector->lines[j], sector)) != NULL)
			{
				if (temp->lightlevel > bright)
				{
					bright = temp->lightlevel;
				}
				if (temp->lightlevel < min)
				{
					min = temp->lightlevel;
				}
			}
		}
		sector->SetLightLevel(int(frac * bright + (1 - frac) * min));
	}
}